

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psac.cpp
# Opt level: O0

bool check_lcp_eq<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,true>
               (suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
                *sa,string *param_2,comm *c)

{
  undefined1 *__x;
  int iVar1;
  reference data;
  size_t size;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end;
  bool local_132;
  bool local_f9;
  bool lcp_correct;
  bool local_e2;
  allocator<char> local_e1;
  bool sa_correct;
  iterator iStack_e0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_d8;
  undefined1 local_d0 [8];
  string gstr;
  undefined1 local_a8 [8];
  vector<char,_std::allocator<char>_> global_str_vec;
  undefined1 local_78 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> glcp;
  undefined1 local_50 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> gisa;
  vector<unsigned_long,_std::allocator<unsigned_long>_> gsa;
  comm *c_local;
  string *local_str_local;
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_true>
  *sa_local;
  
  mxx::gatherv<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &gisa.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&sa->local_SA,0,c);
  mxx::gatherv<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_50,&sa->local_B,0,c);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78);
  mxx::gatherv<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &global_str_vec.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
             &sa->local_LCP,0,c);
  __x = &global_str_vec.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__x);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)__x);
  gstr.field_2._8_8_ = std::__cxx11::string::begin();
  data = __gnu_cxx::
         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)((long)&gstr.field_2 + 8));
  size = std::__cxx11::string::size();
  mxx::gatherv<char>((vector<char,_std::allocator<char>_> *)local_a8,data,size,0,c);
  local_d8._M_current =
       (char *)std::vector<char,_std::allocator<char>_>::begin
                         ((vector<char,_std::allocator<char>_> *)local_a8);
  iStack_e0 = std::vector<char,_std::allocator<char>_>::end
                        ((vector<char,_std::allocator<char>_> *)local_a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::
  string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
            ((string *)local_d0,local_d8,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
             iStack_e0._M_current,&local_e1);
  std::allocator<char>::~allocator(&local_e1);
  local_e2 = true;
  iVar1 = mxx::comm::rank(c);
  if (iVar1 == 0) {
    begin._M_current = (char *)std::__cxx11::string::begin();
    end._M_current = (char *)std::__cxx11::string::end();
    local_e2 = dss::check<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long>
                         (begin,end,
                          (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          &gisa.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  local_f9 = true;
  iVar1 = mxx::comm::rank(c);
  if (iVar1 == 0) {
    local_f9 = check_lcp<unsigned_long>
                         ((string *)local_d0,
                          (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          &gisa.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_50,
                          (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78);
  }
  local_132 = false;
  if (local_e2 != false) {
    local_132 = local_f9;
  }
  std::__cxx11::string::~string((string *)local_d0);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_a8)
  ;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_50);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &gisa.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return local_132;
}

Assistant:

bool check_lcp_eq(suffix_array<Iterator, index_t, _LCP>& sa, const std::string& local_str, const mxx::comm& c) {
    // gather LCP back to root process
    std::vector<index_t> gsa = mxx::gatherv(sa.local_SA, 0, c);
    std::vector<index_t> gisa = mxx::gatherv(sa.local_B, 0, c);
    std::vector<index_t> glcp;
    if (_LCP)
        glcp = mxx::gatherv(sa.local_LCP, 0, c);
    // gather string
    // TODO: use iterator or std::string version for mxx?
    std::vector<char> global_str_vec = mxx::gatherv(&(*local_str.begin()), local_str.size(), 0, c);
    std::string gstr(global_str_vec.begin(), global_str_vec.end());
    bool sa_correct = true;
    if (c.rank() == 0) {
        sa_correct = dss::check(gstr.begin(), gstr.end(), gsa);
    }

    // check LCP
    bool lcp_correct = true;
    if (_LCP) {
        if (c.rank() == 0) {
            lcp_correct = check_lcp(gstr, gsa, gisa, glcp);
        }
    }
    return sa_correct && lcp_correct;
}